

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

bool __thiscall BinNE<0,_4,_0>::propagate(BinNE<0,_4,_0> *this)

{
  Reason r;
  bool bVar1;
  BoolView *pBVar2;
  BoolView *in_RDI;
  Reason m_r_2;
  int64_t m_v_2;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  BoolView *in_stack_ffffffffffffff80;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff90;
  Lit p;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Reason local_40;
  int64_t local_38;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  int local_28;
  int local_24;
  anon_union_8_2_743a5d44_for_Reason_0 local_20;
  undefined8 local_18;
  
  bVar1 = IntView<0>::isFixed((IntView<0> *)0x27da6f);
  if ((bVar1) && (bVar1 = IntView<4>::isFixed((IntView<4> *)0x27da86), bVar1)) {
    in_stack_ffffffffffffff80 =
         (BoolView *)IntView<0>::getVal((IntView<0> *)in_stack_ffffffffffffff80);
    pBVar2 = (BoolView *)IntView<4>::getVal((IntView<4> *)in_stack_ffffffffffffff80);
    if (in_stack_ffffffffffffff80 == pBVar2) {
      local_18 = 0;
      bVar1 = BoolView::setValNotR(in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
      if (bVar1) {
        Reason::Reason((Reason *)&local_20,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          local_24 = (int)IntView<0>::getValLit
                                    ((IntView<0> *)
                                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          local_28 = (int)IntView<4>::getValLit
                                    ((IntView<4> *)
                                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          Reason::Reason((Reason *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Lit)in_stack_ffffffffffffffa4,(Lit)in_stack_ffffffffffffffa0);
        }
        local_30 = local_20;
        bVar1 = BoolView::setVal(in_RDI,SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0),
                                 (Reason)in_stack_ffffffffffffff90);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  bVar1 = IntView<0>::isFixed((IntView<0> *)0x27db7a);
  if (bVar1) {
    local_38 = IntView<0>::getVal((IntView<0> *)in_stack_ffffffffffffff80);
    bVar1 = IntView<4>::remValNotR
                      ((IntView<4> *)in_stack_ffffffffffffff80,
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (bVar1) {
      Reason::Reason(&local_40,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        IntView<0>::getValLit
                  ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        Reason::Reason((Reason *)in_RDI,(Lit)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      }
      bVar1 = IntView<4>::remVal((IntView<4> *)in_RDI,(int64_t)in_stack_ffffffffffffff80,
                                 (Reason)in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff7f);
      if (!bVar1) {
        return false;
      }
    }
  }
  p.x = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  bVar1 = IntView<4>::isFixed((IntView<4> *)0x27dc38);
  if (bVar1) {
    IntView<4>::getVal((IntView<4> *)in_stack_ffffffffffffff80);
    bVar1 = IntView<0>::remValNotR
                      ((IntView<0> *)in_stack_ffffffffffffff80,
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (bVar1) {
      Reason::Reason((Reason *)&stack0xffffffffffffffa0,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        IntView<4>::getValLit
                  ((IntView<4> *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        Reason::Reason((Reason *)in_RDI,p);
      }
      r.field_0._a._4_4_ = in_stack_ffffffffffffffa4;
      r.field_0._a._0_4_ = in_stack_ffffffffffffffa0;
      bVar1 = IntView<0>::remVal((IntView<0> *)in_RDI,(int64_t)in_stack_ffffffffffffff80,r,
                                 (bool)in_stack_ffffffffffffff7f);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		if (x.isFixed() && y.isFixed() && x.getVal() == y.getVal()) {
			setDom(r, setVal, 0, x.getValLit(), y.getValLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		if (x.isFixed()) {
			if (R != 0) {
				setDom(y, remVal, x.getVal(), x.getValLit(), r.getValLit());
			} else {
				setDom(y, remVal, x.getVal(), x.getValLit());
			}
		}
		if (y.isFixed()) {
			if (R != 0) {
				setDom(x, remVal, y.getVal(), y.getValLit(), r.getValLit());
			} else {
				setDom(x, remVal, y.getVal(), y.getValLit());
			}
		}

		return true;
	}